

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

void __thiscall
ConsistencyChecker::printOpError
          (ConsistencyChecker *this,OpTpl *op,Constructor *ct,int4 err1,int4 err2,string *msg)

{
  SleighCompile *this_00;
  SubtableSymbol *this_01;
  OperandSymbol *this_02;
  ostream *poVar1;
  string *psVar2;
  Location *loc;
  string local_1f0 [48];
  ostringstream local_1c0 [8];
  ostringstream msgBuilder;
  SleighSymbol *local_48;
  OperandSymbol *op2;
  OperandSymbol *op1;
  SubtableSymbol *sym;
  string *msg_local;
  int4 err2_local;
  int4 err1_local;
  Constructor *ct_local;
  OpTpl *op_local;
  ConsistencyChecker *this_local;
  
  this_01 = Constructor::getParent(ct);
  this_02 = getOperandSymbol(this,err1,op,ct);
  if (err2 == err1) {
    local_48 = (SleighSymbol *)0x0;
  }
  else {
    local_48 = (SleighSymbol *)getOperandSymbol(this,err2,op,ct);
  }
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  poVar1 = std::operator<<((ostream *)local_1c0,"Size restriction error in table \'");
  psVar2 = SleighSymbol::getName_abi_cxx11_((SleighSymbol *)this_01);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,"\'");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((this_02 == (OperandSymbol *)0x0) || (local_48 == (SleighSymbol *)0x0)) {
    if (this_02 == (OperandSymbol *)0x0) {
      if (local_48 == (SleighSymbol *)0x0) {
        std::operator<<((ostream *)local_1c0,"  Problem");
      }
      else {
        poVar1 = std::operator<<((ostream *)local_1c0,"  Problem with operand 2 \'");
        psVar2 = SleighSymbol::getName_abi_cxx11_(local_48);
        poVar1 = std::operator<<(poVar1,(string *)psVar2);
        std::operator<<(poVar1,"\'");
      }
    }
    else {
      poVar1 = std::operator<<((ostream *)local_1c0,"  Problem with operand 1 \'");
      psVar2 = SleighSymbol::getName_abi_cxx11_((SleighSymbol *)this_02);
      poVar1 = std::operator<<(poVar1,(string *)psVar2);
      std::operator<<(poVar1,"\'");
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)local_1c0,"  Problem with operands \'");
    psVar2 = SleighSymbol::getName_abi_cxx11_((SleighSymbol *)this_02);
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    poVar1 = std::operator<<(poVar1,"\' and \'");
    psVar2 = SleighSymbol::getName_abi_cxx11_(local_48);
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    std::operator<<(poVar1,"\'");
  }
  std::operator<<((ostream *)local_1c0," in ");
  printOpName(this,(ostream *)local_1c0,op);
  poVar1 = std::operator<<((ostream *)local_1c0," operator");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  ");
  std::operator<<(poVar1,(string *)msg);
  this_00 = this->compiler;
  loc = SleighCompile::getLocation(this_00,ct);
  std::__cxx11::ostringstream::str();
  SleighCompile::reportError(this_00,loc,local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return;
}

Assistant:

void ConsistencyChecker::printOpError(OpTpl *op,Constructor *ct,int4 err1,int4 err2,const string &msg)

{
  SubtableSymbol *sym = ct->getParent();
  OperandSymbol *op1,*op2;

  op1 = getOperandSymbol(err1,op,ct);
  if (err2 != err1)
    op2 = getOperandSymbol(err2,op,ct);
  else
    op2 = (OperandSymbol *)0;

  ostringstream msgBuilder;

  msgBuilder << "Size restriction error in table '" << sym->getName() << "'" << endl;
  if ((op1 != (OperandSymbol *)0)&&(op2 != (OperandSymbol *)0))
    msgBuilder << "  Problem with operands '" << op1->getName() << "' and '" << op2->getName() << "'";
  else if (op1 != (OperandSymbol *)0)
    msgBuilder << "  Problem with operand 1 '" << op1->getName() << "'";
  else if (op2 != (OperandSymbol *)0)
    msgBuilder << "  Problem with operand 2 '" << op2->getName() << "'";
  else
    msgBuilder << "  Problem";
  msgBuilder << " in ";
  printOpName(msgBuilder,op);
  msgBuilder << " operator" << endl << "  " << msg;

  compiler->reportError(compiler->getLocation(ct), msgBuilder.str());
}